

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnDelegateExpr
          (BinaryReaderInterp *this,Index depth)

{
  Index index;
  bool bVar1;
  Offset OVar2;
  Label *pLVar3;
  reference pvVar4;
  size_type sVar5;
  Label *target_label;
  Offset offset;
  HandlerDesc *desc;
  Label *label;
  Var local_88;
  Location local_40;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  local_1c = depth;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  index = local_1c;
  GetLocation((Location *)&label,this);
  Var::Var(&local_88,index,(Location *)&label);
  local_20 = (Enum)SharedValidator::OnDelegate(&this->validator_,&local_40,&local_88);
  bVar1 = Failed((Result)local_20);
  Var::~Var(&local_88);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pLVar3 = TopLabel(this);
    if (pLVar3->kind != Try) {
      __assert_fail("label->kind == LabelKind::Try",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6b4,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    pvVar4 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
             operator[](&this->func_->handlers,(ulong)pLVar3->handler_desc_index);
    pvVar4->kind = Delegate;
    OVar2 = pLVar3->offset;
    Istream::Emit(this->istream_,Br);
    if (OVar2 != 0xffffffff) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6b9,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    sVar5 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    OVar2 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)sVar5 - 1,OVar2);
    Istream::Emit(this->istream_,0xffffffff);
    OVar2 = Istream::end(this->istream_);
    pvVar4->try_end_offset = OVar2;
    pLVar3 = GetNearestTryLabel(this,local_1c + 1);
    if (pLVar3 == (Label *)0x0) {
      __assert_fail("target_label",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6be,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    pvVar4->field_4 = (anon_union_4_2_59e55c6f_for_HandlerDesc_4)pLVar3->handler_desc_index;
    FixupTopLabel(this);
    PopLabel(this);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnDelegateExpr(Index depth) {
  CHECK_RESULT(validator_.OnDelegate(GetLocation(), Var(depth, GetLocation())));
  Label* label = TopLabel();
  assert(label->kind == LabelKind::Try);
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Delegate;
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  desc.try_end_offset = istream_.end();
  Label* target_label = GetNearestTryLabel(depth + 1);
  assert(target_label);
  desc.delegate_handler_index = target_label->handler_desc_index;
  FixupTopLabel();
  PopLabel();
  return Result::Ok;
}